

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

void google::protobuf::internal::WireFormat::SerializeUnknownFields
               (UnknownFieldSet *unknown_fields,CodedOutputStream *output)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  bool bVar2;
  long lVar3;
  LogMessage *other;
  byte *pbVar4;
  int iVar5;
  byte *pbVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  pointer pUVar10;
  uint uVar11;
  long lVar12;
  LogFinisher local_69;
  LogMessage local_68;
  
  lVar12 = 0;
  do {
    pvVar1 = unknown_fields->fields_;
    if (pvVar1 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = (long)(int)((ulong)((long)(pvVar1->
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar1->
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    if (lVar3 <= lVar12) {
      return;
    }
    if (pvVar1 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                 ,0x11c);
      other = LogMessage::operator<<(&local_68,"CHECK failed: fields_ != NULL: ");
      LogFinisher::operator=(&local_69,other);
      LogMessage::~LogMessage(&local_68);
    }
    pUVar10 = (unknown_fields->fields_->
              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar11 = pUVar10[lVar12].type_;
    if (uVar11 < 5) {
      pUVar10 = pUVar10 + lVar12;
      switch(uVar11) {
      case 0:
        uVar11 = pUVar10->number_ << 3;
        if (output->buffer_size_ < 5) {
          io::CodedOutputStream::WriteVarint32SlowPath(output,uVar11);
        }
        else {
          pbVar4 = output->buffer_;
          pbVar6 = pbVar4;
          uVar7 = uVar11;
          if (0x7f < uVar11) {
            do {
              *pbVar6 = (byte)uVar11 | 0x80;
              uVar7 = uVar11 >> 7;
              pbVar6 = pbVar6 + 1;
              bVar2 = 0x3fff < uVar11;
              uVar11 = uVar7;
            } while (bVar2);
          }
          *pbVar6 = (byte)uVar7;
          iVar5 = ((int)pbVar6 - (int)pbVar4) + 1;
          output->buffer_ = output->buffer_ + iVar5;
          output->buffer_size_ = output->buffer_size_ - iVar5;
        }
        if (pUVar10->type_ != 0) {
          __assert_fail("type() == TYPE_VARINT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x131,"uint64 google::protobuf::UnknownField::varint() const");
        }
        uVar8 = (pUVar10->data_).varint_;
        if (output->buffer_size_ < 10) {
          io::CodedOutputStream::WriteVarint64SlowPath(output,uVar8);
        }
        else {
          pbVar4 = output->buffer_;
          pbVar6 = pbVar4;
          uVar9 = uVar8;
          if (0x7f < uVar8) {
            do {
              *pbVar6 = (byte)uVar8 | 0x80;
              uVar9 = uVar8 >> 7;
              pbVar6 = pbVar6 + 1;
              bVar2 = 0x3fff < uVar8;
              uVar8 = uVar9;
            } while (bVar2);
          }
          *pbVar6 = (byte)uVar9;
LAB_0033d656:
          iVar5 = ((int)pbVar6 - (int)pbVar4) + 1;
          output->buffer_ = output->buffer_ + iVar5;
          output->buffer_size_ = output->buffer_size_ - iVar5;
        }
        break;
      case 1:
        uVar11 = pUVar10->number_ * 8 + 5;
        uVar8 = (ulong)uVar11;
        if (output->buffer_size_ < 5) {
          io::CodedOutputStream::WriteVarint32SlowPath(output,uVar11);
        }
        else {
          pbVar4 = output->buffer_;
          pbVar6 = pbVar4;
          if (0x7f < pUVar10->number_ << 3) {
            do {
              uVar11 = (uint)uVar8;
              *pbVar6 = (byte)uVar8 | 0x80;
              uVar8 = uVar8 >> 7;
              pbVar6 = pbVar6 + 1;
            } while (0x3fff < uVar11);
          }
          *pbVar6 = (byte)uVar8;
          iVar5 = ((int)pbVar6 - (int)pbVar4) + 1;
          output->buffer_ = output->buffer_ + iVar5;
          output->buffer_size_ = output->buffer_size_ - iVar5;
        }
        if (pUVar10->type_ != 1) {
          __assert_fail("type() == TYPE_FIXED32",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x135,"uint32 google::protobuf::UnknownField::fixed32() const");
        }
        io::CodedOutputStream::WriteLittleEndian32(output,(pUVar10->data_).fixed32_);
        break;
      case 2:
        uVar11 = pUVar10->number_ * 8 + 1;
        uVar8 = (ulong)uVar11;
        if (output->buffer_size_ < 5) {
          io::CodedOutputStream::WriteVarint32SlowPath(output,uVar11);
        }
        else {
          pbVar4 = output->buffer_;
          pbVar6 = pbVar4;
          if (0x7f < pUVar10->number_ << 3) {
            do {
              uVar11 = (uint)uVar8;
              *pbVar6 = (byte)uVar8 | 0x80;
              uVar8 = uVar8 >> 7;
              pbVar6 = pbVar6 + 1;
            } while (0x3fff < uVar11);
          }
          *pbVar6 = (byte)uVar8;
          iVar5 = ((int)pbVar6 - (int)pbVar4) + 1;
          output->buffer_ = output->buffer_ + iVar5;
          output->buffer_size_ = output->buffer_size_ - iVar5;
        }
        if (pUVar10->type_ != 2) {
          __assert_fail("type() == TYPE_FIXED64",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x139,"uint64 google::protobuf::UnknownField::fixed64() const");
        }
        io::CodedOutputStream::WriteLittleEndian64(output,(pUVar10->data_).varint_);
        break;
      case 3:
        uVar11 = pUVar10->number_ * 8 + 2;
        uVar8 = (ulong)uVar11;
        if (output->buffer_size_ < 5) {
          io::CodedOutputStream::WriteVarint32SlowPath(output,uVar11);
        }
        else {
          pbVar4 = output->buffer_;
          pbVar6 = pbVar4;
          if (0x7f < pUVar10->number_ << 3) {
            do {
              uVar11 = (uint)uVar8;
              *pbVar6 = (byte)uVar8 | 0x80;
              uVar8 = uVar8 >> 7;
              pbVar6 = pbVar6 + 1;
            } while (0x3fff < uVar11);
          }
          *pbVar6 = (byte)uVar8;
          iVar5 = ((int)pbVar6 - (int)pbVar4) + 1;
          output->buffer_ = output->buffer_ + iVar5;
          output->buffer_size_ = output->buffer_size_ - iVar5;
        }
        if (pUVar10->type_ != 3) {
LAB_0033d67d:
          __assert_fail("type() == TYPE_LENGTH_DELIMITED",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x13d,
                        "const string &google::protobuf::UnknownField::length_delimited() const");
        }
        uVar11 = *(uint *)((pUVar10->data_).varint_ + 8);
        if (output->buffer_size_ < 5) {
          io::CodedOutputStream::WriteVarint32SlowPath(output,uVar11);
        }
        else {
          pbVar4 = output->buffer_;
          pbVar6 = pbVar4;
          uVar7 = uVar11;
          if (0x7f < uVar11) {
            do {
              *pbVar6 = (byte)uVar11 | 0x80;
              uVar7 = uVar11 >> 7;
              pbVar6 = pbVar6 + 1;
              bVar2 = 0x3fff < uVar11;
              uVar11 = uVar7;
            } while (bVar2);
          }
          *pbVar6 = (byte)uVar7;
          iVar5 = ((int)pbVar6 - (int)pbVar4) + 1;
          output->buffer_ = output->buffer_ + iVar5;
          output->buffer_size_ = output->buffer_size_ - iVar5;
        }
        if (pUVar10->type_ != 3) goto LAB_0033d67d;
        pvVar1 = ((pUVar10->data_).group_)->fields_;
        iVar5 = *(int *)&(pUVar10->data_).group_[1].fields_;
        if (output->aliasing_enabled_ == true) {
          io::CodedOutputStream::WriteAliasedRaw(output,pvVar1,iVar5);
        }
        else {
          io::CodedOutputStream::WriteRaw(output,pvVar1,iVar5);
        }
        break;
      case 4:
        uVar11 = pUVar10->number_ * 8 + 3;
        uVar8 = (ulong)uVar11;
        if (output->buffer_size_ < 5) {
          io::CodedOutputStream::WriteVarint32SlowPath(output,uVar11);
        }
        else {
          pbVar4 = output->buffer_;
          pbVar6 = pbVar4;
          if (0x7f < pUVar10->number_ << 3) {
            do {
              uVar11 = (uint)uVar8;
              *pbVar6 = (byte)uVar8 | 0x80;
              uVar8 = uVar8 >> 7;
              pbVar6 = pbVar6 + 1;
            } while (0x3fff < uVar11);
          }
          *pbVar6 = (byte)uVar8;
          iVar5 = ((int)pbVar6 - (int)pbVar4) + 1;
          output->buffer_ = output->buffer_ + iVar5;
          output->buffer_size_ = output->buffer_size_ - iVar5;
        }
        if (pUVar10->type_ != 4) {
          __assert_fail("type() == TYPE_GROUP",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x141,
                        "const UnknownFieldSet &google::protobuf::UnknownField::group() const");
        }
        SerializeUnknownFields((pUVar10->data_).group_,output);
        uVar11 = pUVar10->number_ * 8 + 4;
        uVar8 = (ulong)uVar11;
        if (4 < output->buffer_size_) {
          pbVar4 = output->buffer_;
          pbVar6 = pbVar4;
          if (0x7f < pUVar10->number_ << 3) {
            do {
              uVar11 = (uint)uVar8;
              *pbVar6 = (byte)uVar8 | 0x80;
              uVar8 = uVar8 >> 7;
              pbVar6 = pbVar6 + 1;
            } while (0x3fff < uVar11);
          }
          *pbVar6 = (byte)uVar8;
          goto LAB_0033d656;
        }
        io::CodedOutputStream::WriteVarint32SlowPath(output,uVar11);
      }
    }
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

void WireFormat::SerializeUnknownFields(const UnknownFieldSet& unknown_fields,
                                        io::CodedOutputStream* output) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);
    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_VARINT));
        output->WriteVarint64(field.varint());
        break;
      case UnknownField::TYPE_FIXED32:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_FIXED32));
        output->WriteLittleEndian32(field.fixed32());
        break;
      case UnknownField::TYPE_FIXED64:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_FIXED64));
        output->WriteLittleEndian64(field.fixed64());
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
        output->WriteVarint32(field.length_delimited().size());
        output->WriteRawMaybeAliased(field.length_delimited().data(),
                                     field.length_delimited().size());
        break;
      case UnknownField::TYPE_GROUP:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_START_GROUP));
        SerializeUnknownFields(field.group(), output);
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_END_GROUP));
        break;
    }
  }
}